

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O1

ImageSpec * __thiscall
ImageInput::spec(ImageSpec *__return_storage_ptr__,ImageInput *this,uint32_t param_1,
                uint32_t param_2)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  *(undefined8 *)&(__return_storage_ptr__->formatDesc).basic.field_0xd = 0;
  *(undefined8 *)&(__return_storage_ptr__->formatDesc).basic = 0;
  *(undefined8 *)&(__return_storage_ptr__->formatDesc).basic.field_0x8 = 0;
  (__return_storage_ptr__->formatDesc).extended.oeGamma = -1.0;
  (__return_storage_ptr__->formatDesc).extended.iccProfile.name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->formatDesc).extended.iccProfile.name.field_2;
  (__return_storage_ptr__->formatDesc).extended.iccProfile.name._M_string_length = 0;
  (__return_storage_ptr__->formatDesc).extended.iccProfile.name.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->formatDesc).extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->formatDesc).extended.iccProfile.profile.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->formatDesc).extended.iccProfile.profile.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (__return_storage_ptr__->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->formatDesc).samples.
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->imageHeight + 3) = 0;
  uVar3 = (ulong)this->curSubimage;
  lVar5 = *(long *)&this->images;
  uVar4 = (*(long *)&this->field_0x298 - lVar5 >> 4) * -0x71c71c71c71c71c7;
  if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
    puVar1 = (undefined8 *)(lVar5 + uVar3 * 0x90);
    uVar2 = puVar1[1];
    *(undefined8 *)&(__return_storage_ptr__->formatDesc).basic = *puVar1;
    *(undefined8 *)&(__return_storage_ptr__->formatDesc).basic.field_0x8 = uVar2;
    uVar2 = puVar1[2];
    (__return_storage_ptr__->formatDesc).extended.channelCount = (int)uVar2;
    (__return_storage_ptr__->formatDesc).extended.sameUnitAllChannels =
         (bool)(char)((ulong)uVar2 >> 0x20);
    *(int3 *)&(__return_storage_ptr__->formatDesc).extended.field_0x5 = (int3)((ulong)uVar2 >> 0x28)
    ;
    (__return_storage_ptr__->formatDesc).extended.oeGamma = *(float *)(puVar1 + 3);
    std::__cxx11::string::_M_assign
              ((string *)&(__return_storage_ptr__->formatDesc).extended.iccProfile);
    lVar5 = lVar5 + uVar3 * 0x90;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(__return_storage_ptr__->formatDesc).extended.iccProfile.profile,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar5 + 0x40));
    std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::operator=
              (&(__return_storage_ptr__->formatDesc).samples,
               (vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
               (lVar5 + 0x58));
    uVar2 = *(undefined8 *)(lVar5 + 0x70);
    *(undefined8 *)((long)&__return_storage_ptr__->imageHeight + 3) = *(undefined8 *)(lVar5 + 0x77);
    __return_storage_ptr__->imageWidth = (int)uVar2;
    __return_storage_ptr__->imageHeight = (int)((ulong)uVar2 >> 0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual ImageSpec spec (uint32_t /*subimage*/, uint32_t /*miplevel=0*/) {
        ImageSpec ret;
        if (curSubimage < images.size()) {
            ret = images[curSubimage].spec;
        }
        return ret;
    }